

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O0

void mt_queue(BGZF *fp)

{
  bgzf_mtaux_t *pbVar1;
  mtaux_t *mt;
  BGZF *fp_local;
  
  pbVar1 = fp->mt;
  if (pbVar1->curr < pbVar1->n_blks) {
    memcpy(pbVar1->blk[pbVar1->curr],fp->uncompressed_block,(long)fp->block_offset);
    pbVar1->len[pbVar1->curr] = fp->block_offset;
    fp->block_offset = 0;
    pbVar1->curr = pbVar1->curr + 1;
    return;
  }
  __assert_fail("mt->curr < mt->n_blks",
                "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/bgzf.c"
                ,0x2a9,"void mt_queue(BGZF *)");
}

Assistant:

static void mt_queue(BGZF *fp)
{
    mtaux_t *mt = fp->mt;
    assert(mt->curr < mt->n_blks); // guaranteed by the caller
    memcpy(mt->blk[mt->curr], fp->uncompressed_block, fp->block_offset);
    mt->len[mt->curr] = fp->block_offset;
    fp->block_offset = 0;
    ++mt->curr;
}